

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

bool __thiscall
bssl::tls13_advance_key_schedule(bssl *this,SSL_HANDSHAKE *hs,Span<const_unsigned_char> in)

{
  string_view label;
  Span<const_unsigned_char> hash;
  Span<const_unsigned_char> secret;
  bool bVar1;
  int iVar2;
  EVP_MD *type;
  EVP_MD *digest;
  Span<const_unsigned_char> in_00;
  bool local_d1;
  Span<unsigned_char> local_c0;
  uchar *local_b0;
  size_t sStack_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  uchar *local_90;
  size_t local_88;
  Span<unsigned_char> local_80;
  uint local_6c;
  uchar local_68 [4];
  uint derive_context_len;
  uint8_t derive_context [64];
  SSL_HANDSHAKE *hs_local;
  Span<const_unsigned_char> in_local;
  
  type = (EVP_MD *)SSLTranscript::Digest((SSLTranscript *)(this + 0x208));
  iVar2 = EVP_Digest((void *)0x0,0,local_68,&local_6c,type,(ENGINE *)0x0);
  local_d1 = false;
  if (iVar2 != 0) {
    Span<unsigned_char>::
    Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
              (&local_80,(InplaceVector<unsigned_char,_64UL> *)(this + 0x20));
    digest = SSLTranscript::Digest((SSLTranscript *)(this + 0x208));
    Span<unsigned_char_const>::
    Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
              ((Span<unsigned_char_const> *)&local_90,
               (InplaceVector<unsigned_char,_64UL> *)(this + 0x20));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"derived");
    Span<unsigned_char>::Span(&local_c0,local_68,(ulong)local_6c);
    Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_b0,&local_c0);
    iVar2 = SSL_is_dtls(*(SSL **)this);
    secret.size_ = local_88;
    secret.data_ = local_90;
    label._M_str = local_a0._M_str;
    label._M_len = local_a0._M_len;
    hash.size_ = sStack_a8;
    hash.data_ = local_b0;
    bVar1 = hkdf_expand_label(local_80,digest,secret,label,hash,iVar2 != 0);
    local_d1 = false;
    if (bVar1) {
      in_00.size_ = local_88;
      in_00.data_ = in.data_;
      local_d1 = hkdf_extract_to_secret
                           (this,(SSL_HANDSHAKE *)(this + 0x208),(SSLTranscript *)hs,in_00);
    }
  }
  return local_d1;
}

Assistant:

bool tls13_advance_key_schedule(SSL_HANDSHAKE *hs, Span<const uint8_t> in) {
  uint8_t derive_context[EVP_MAX_MD_SIZE];
  unsigned derive_context_len;
  return EVP_Digest(nullptr, 0, derive_context, &derive_context_len,
                    hs->transcript.Digest(), nullptr) &&
         hkdf_expand_label(Span(hs->secret), hs->transcript.Digest(),
                           hs->secret, kTLS13LabelDerived,
                           Span(derive_context, derive_context_len),
                           SSL_is_dtls(hs->ssl)) &&
         hkdf_extract_to_secret(hs, hs->transcript, in);
}